

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O3

xcb_generic_iterator_t xcb_input_device_ctl_end(xcb_input_device_ctl_iterator_t i)

{
  int iVar1;
  ulong uVar2;
  xcb_input_device_ctl_t *R;
  uint uVar3;
  ulong uVar4;
  xcb_input_device_ctl_t *pxVar5;
  long in_FS_OFFSET;
  xcb_generic_iterator_t xVar6;
  xcb_input_device_ctl_data_t xStack_78;
  long local_28;
  
  uVar4 = i._8_8_;
  pxVar5 = i.data;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (i.rem < 1) {
    uVar2 = uVar4 >> 0x20;
  }
  else {
    uVar3 = i.rem + 1;
    uVar4 = 0;
    do {
      iVar1 = xcb_input_device_ctl_data_unpack(pxVar5 + 1,pxVar5->control_id,&xStack_78);
      uVar2 = (ulong)(iVar1 + 4);
      pxVar5 = (xcb_input_device_ctl_t *)((long)&pxVar5->control_id + uVar2);
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  xVar6._8_8_ = uVar4 & 0xffffffff | uVar2 << 0x20;
  xVar6.data = pxVar5;
  return xVar6;
}

Assistant:

xcb_generic_iterator_t
xcb_input_device_ctl_end (xcb_input_device_ctl_iterator_t i)
{
    xcb_generic_iterator_t ret;
    while(i.rem > 0)
        xcb_input_device_ctl_next(&i);
    ret.data = i.data;
    ret.rem = i.rem;
    ret.index = i.index;
    return ret;
}